

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void analyze_region(FIRSTPASS_STATS *stats,int k,REGIONS *regions)

{
  double dVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  FIRSTPASS_STATS *pFVar9;
  double dVar10;
  double dVar11;
  double num_frames;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  
  dVar10 = 0.0;
  dVar11 = 0.0;
  regions[k].avg_intra_err = 0.0;
  (&regions[k].avg_intra_err)[1] = 0.0;
  regions[k].avg_cor_coeff = 0.0;
  (&regions[k].avg_cor_coeff)[1] = 0.0;
  auVar6 = _DAT_00457cd0;
  iVar2 = regions[k].start;
  lVar7 = (long)iVar2;
  iVar3 = regions[k].last;
  dVar12 = (double)((iVar3 - iVar2) + 1);
  pFVar9 = stats + lVar7;
  dVar14 = 0.0;
  dVar13 = 0.0;
  for (lVar8 = lVar7; lVar8 <= iVar3; lVar8 = lVar8 + 1) {
    if ((k == 0) && (lVar8 <= lVar7)) {
      dVar1 = pFVar9->coded_error;
    }
    else {
      dVar1 = pFVar9->coded_error;
      dVar17 = dVar1;
      if (dVar1 <= pFVar9[-1].coded_error) {
        dVar17 = pFVar9[-1].coded_error;
      }
      if (dVar17 <= 0.001) {
        dVar17 = 0.001;
      }
      dVar13 = dVar13 + (pFVar9->sr_coded_error / dVar17) /
                        (double)(int)(iVar3 - (iVar2 + -1 + (uint)(k == 0)));
      regions[k].avg_sr_fr_ratio = dVar13;
    }
    auVar15._8_8_ = dVar1;
    auVar15._0_8_ = pFVar9->intra_error;
    auVar4._8_8_ = dVar12;
    auVar4._0_8_ = dVar12;
    auVar16 = divpd(auVar15,auVar4);
    dVar10 = dVar10 + auVar16._0_8_;
    dVar11 = dVar11 + auVar16._8_8_;
    regions[k].avg_intra_err = dVar10;
    regions[k].avg_coded_err = dVar11;
    auVar16._0_8_ = pFVar9->noise_var;
    auVar16._8_8_ = pFVar9->cor_coeff;
    auVar16 = maxpd(auVar16,auVar6);
    auVar5._8_8_ = dVar12;
    auVar5._0_8_ = dVar12;
    auVar16 = divpd(auVar16,auVar5);
    dVar14 = dVar14 + auVar16._8_8_;
    regions[k].avg_noise_var = regions[k].avg_noise_var + auVar16._0_8_;
    regions[k].avg_cor_coeff = dVar14;
    pFVar9 = pFVar9 + 1;
  }
  return;
}

Assistant:

static void analyze_region(const FIRSTPASS_STATS *stats, int k,
                           REGIONS *regions) {
  int i;
  regions[k].avg_cor_coeff = 0;
  regions[k].avg_sr_fr_ratio = 0;
  regions[k].avg_intra_err = 0;
  regions[k].avg_coded_err = 0;

  int check_first_sr = (k != 0);

  for (i = regions[k].start; i <= regions[k].last; i++) {
    if (i > regions[k].start || check_first_sr) {
      double num_frames =
          (double)(regions[k].last - regions[k].start + check_first_sr);
      double max_coded_error =
          AOMMAX(stats[i].coded_error, stats[i - 1].coded_error);
      double this_ratio =
          stats[i].sr_coded_error / AOMMAX(max_coded_error, 0.001);
      regions[k].avg_sr_fr_ratio += this_ratio / num_frames;
    }

    regions[k].avg_intra_err +=
        stats[i].intra_error / (double)(regions[k].last - regions[k].start + 1);
    regions[k].avg_coded_err +=
        stats[i].coded_error / (double)(regions[k].last - regions[k].start + 1);

    regions[k].avg_cor_coeff +=
        AOMMAX(stats[i].cor_coeff, 0.001) /
        (double)(regions[k].last - regions[k].start + 1);
    regions[k].avg_noise_var +=
        AOMMAX(stats[i].noise_var, 0.001) /
        (double)(regions[k].last - regions[k].start + 1);
  }
}